

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O2

PrimaryBlockEventExpressionSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::PrimaryBlockEventExpressionSyntax,slang::parsing::Token&,slang::syntax::NameSyntax&>
          (BumpAllocator *this,Token *args,NameSyntax *args_1)

{
  Info *pIVar1;
  TokenKind TVar2;
  undefined1 uVar3;
  NumericTokenFlags NVar4;
  uint32_t uVar5;
  PrimaryBlockEventExpressionSyntax *pPVar6;
  
  pPVar6 = (PrimaryBlockEventExpressionSyntax *)allocate(this,0x30,8);
  TVar2 = args->kind;
  uVar3 = args->field_0x2;
  NVar4.raw = (args->numFlags).raw;
  uVar5 = args->rawLen;
  pIVar1 = args->info;
  (pPVar6->super_BlockEventExpressionSyntax).super_SyntaxNode.kind = PrimaryBlockEventExpression;
  (pPVar6->super_BlockEventExpressionSyntax).super_SyntaxNode.parent = (SyntaxNode *)0x0;
  (pPVar6->super_BlockEventExpressionSyntax).super_SyntaxNode.previewNode = (SyntaxNode *)0x0;
  (pPVar6->keyword).kind = TVar2;
  (pPVar6->keyword).field_0x2 = uVar3;
  (pPVar6->keyword).numFlags = (NumericTokenFlags)NVar4.raw;
  (pPVar6->keyword).rawLen = uVar5;
  (pPVar6->keyword).info = pIVar1;
  (pPVar6->name).ptr = args_1;
  (args_1->super_ExpressionSyntax).super_SyntaxNode.parent = (SyntaxNode *)pPVar6;
  return pPVar6;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }